

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

bool __thiscall
basist::bitwise_decoder::read_huffman_table(bitwise_decoder *this,huffman_decoding_table *ct)

{
  uchar uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uchar *puVar6;
  bool bVar7;
  undefined1 uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint8_vec code_sizes;
  uint8_t code_length_code_sizes [21];
  huffman_decoding_table code_length_table;
  
  huffman_decoding_table::clear(ct);
  uVar2 = get_bits(this,0xe);
  if (uVar2 == 0) {
    bVar7 = true;
  }
  else {
    if (uVar2 < 0x4001) {
      code_length_code_sizes[0] = '\0';
      code_length_code_sizes[1] = '\0';
      code_length_code_sizes[2] = '\0';
      code_length_code_sizes[3] = '\0';
      code_length_code_sizes[4] = '\0';
      code_length_code_sizes[5] = '\0';
      code_length_code_sizes[6] = '\0';
      code_length_code_sizes[7] = '\0';
      code_length_code_sizes[8] = '\0';
      code_length_code_sizes[9] = '\0';
      code_length_code_sizes[10] = '\0';
      code_length_code_sizes[0xb] = '\0';
      code_length_code_sizes[0xc] = '\0';
      code_length_code_sizes[0xd] = '\0';
      code_length_code_sizes[0xe] = '\0';
      code_length_code_sizes[0xf] = '\0';
      code_length_code_sizes[0x10] = '\0';
      code_length_code_sizes[0x11] = '\0';
      code_length_code_sizes[0x12] = '\0';
      code_length_code_sizes[0x13] = '\0';
      code_length_code_sizes[0x14] = '\0';
      uVar3 = get_bits(this,5);
      if (0xffffffea < uVar3 - 0x16) {
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          uVar4 = get_bits(this,3);
          code_length_code_sizes[(byte)(&basisu::g_huffman_sorted_codelength_codes)[uVar9]] =
               (uint8_t)uVar4;
        }
        code_length_table.m_tree.m_p = (short *)0x0;
        code_length_table.m_tree.m_size = 0;
        code_length_table.m_tree.m_capacity = 0;
        code_length_table.m_lookup.m_p = (int *)0x0;
        code_length_table.m_lookup.m_size = 0;
        code_length_table.m_lookup.m_capacity = 0;
        code_length_table.m_code_sizes.m_p = (uchar *)0x0;
        code_length_table.m_code_sizes.m_size = 0;
        code_length_table.m_code_sizes.m_capacity = 0;
        iVar5 = huffman_decoding_table::init(&code_length_table,(EVP_PKEY_CTX *)0x15);
        if (((byte)iVar5 & code_length_table.m_code_sizes.m_size != 0) == 0) {
          uVar8 = 0;
        }
        else {
          basisu::vector<unsigned_char>::vector(&code_sizes,(ulong)uVar2);
          uVar10 = 0;
          while( true ) {
            if (uVar2 <= uVar10) break;
            uVar3 = decode_huffman(this,&code_length_table,10);
            uVar9 = (ulong)uVar10;
            if ((int)uVar3 < 0x11) {
              uVar10 = uVar10 + 1;
              puVar6 = basisu::vector<unsigned_char>::operator[](&code_sizes,uVar9);
              *puVar6 = (uchar)uVar3;
            }
            else if (uVar3 == 0x12) {
              uVar3 = get_bits(this,7);
              uVar10 = uVar10 + uVar3 + 0xb;
            }
            else if (uVar3 == 0x11) {
              uVar3 = get_bits(this,3);
              uVar10 = uVar10 + uVar3 + 3;
            }
            else {
              if (uVar10 == 0) goto LAB_001364ce;
              if (uVar3 == 0x13) {
                uVar3 = get_bits(this,2);
                iVar5 = uVar3 + 3;
              }
              else {
                uVar3 = get_bits(this,7);
                iVar5 = uVar3 + 7;
              }
              puVar6 = basisu::vector<unsigned_char>::operator[](&code_sizes,(ulong)(uVar10 - 1));
              uVar1 = *puVar6;
              if (uVar1 == '\0') goto LAB_001364ce;
              iVar11 = 0;
              do {
                if (uVar2 <= uVar9) goto LAB_001364ce;
                puVar6 = basisu::vector<unsigned_char>::operator[](&code_sizes,uVar9);
                *puVar6 = uVar1;
                iVar11 = iVar11 + -1;
                uVar9 = uVar9 + 1;
              } while (-iVar5 != iVar11);
              uVar10 = uVar10 - iVar11;
            }
          }
          if (uVar10 == uVar2) {
            basisu::vector<unsigned_char>::operator[](&code_sizes,0);
            iVar5 = huffman_decoding_table::init(ct,(EVP_PKEY_CTX *)(ulong)uVar2);
            uVar8 = (undefined1)iVar5;
          }
          else {
LAB_001364ce:
            uVar8 = 0;
          }
          free(code_sizes.m_p);
        }
        huffman_decoding_table::~huffman_decoding_table(&code_length_table);
        return (bool)uVar8;
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool read_huffman_table(huffman_decoding_table &ct)
		{
			ct.clear();

			const uint32_t total_used_syms = get_bits(basisu::cHuffmanMaxSymsLog2);

			if (!total_used_syms)
				return true;
			if (total_used_syms > basisu::cHuffmanMaxSyms)
				return false;

			uint8_t code_length_code_sizes[basisu::cHuffmanTotalCodelengthCodes];
			basisu::clear_obj(code_length_code_sizes);

			const uint32_t num_codelength_codes = get_bits(5);
			if ((num_codelength_codes < 1) || (num_codelength_codes > basisu::cHuffmanTotalCodelengthCodes))
				return false;

			for (uint32_t i = 0; i < num_codelength_codes; i++)
				code_length_code_sizes[basisu::g_huffman_sorted_codelength_codes[i]] = static_cast<uint8_t>(get_bits(3));

			huffman_decoding_table code_length_table;
			if (!code_length_table.init(basisu::cHuffmanTotalCodelengthCodes, code_length_code_sizes))
				return false;

			if (!code_length_table.is_valid())
				return false;

			basisu::uint8_vec code_sizes(total_used_syms);

			uint32_t cur = 0;
			while (cur < total_used_syms)
			{
				int c = decode_huffman(code_length_table);

				if (c <= 16)
					code_sizes[cur++] = static_cast<uint8_t>(c);
				else if (c == basisu::cHuffmanSmallZeroRunCode)
					cur += get_bits(basisu::cHuffmanSmallZeroRunExtraBits) + basisu::cHuffmanSmallZeroRunSizeMin;
				else if (c == basisu::cHuffmanBigZeroRunCode)
					cur += get_bits(basisu::cHuffmanBigZeroRunExtraBits) + basisu::cHuffmanBigZeroRunSizeMin;
				else
				{
					if (!cur)
						return false;

					uint32_t l;
					if (c == basisu::cHuffmanSmallRepeatCode)
						l = get_bits(basisu::cHuffmanSmallRepeatExtraBits) + basisu::cHuffmanSmallRepeatSizeMin;
					else
						l = get_bits(basisu::cHuffmanBigRepeatExtraBits) + basisu::cHuffmanBigRepeatSizeMin;

					const uint8_t prev = code_sizes[cur - 1];
					if (prev == 0)
						return false;
					do
					{
						if (cur >= total_used_syms)
							return false;
						code_sizes[cur++] = prev;
					} while (--l > 0);
				}
			}

			if (cur != total_used_syms)
				return false;

			return ct.init(total_used_syms, &code_sizes[0]);
		}